

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O3

int BN_lshift1(BIGNUM *r,BIGNUM *a)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  BIGNUM *pBVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  if (r == a) {
    pBVar4 = bn_wexpand((BIGNUM *)r,a->top + 1);
    if (pBVar4 == (BIGNUM *)0x0) {
      return 0;
    }
    iVar5 = a->top;
  }
  else {
    r->neg = a->neg;
    pBVar4 = bn_wexpand((BIGNUM *)r,a->top + 1);
    if (pBVar4 == (BIGNUM *)0x0) {
      return 0;
    }
    iVar5 = a->top;
    r->top = iVar5;
  }
  if (0 < iVar5) {
    puVar1 = r->d;
    puVar2 = a->d;
    lVar6 = 0;
    uVar7 = 0;
    do {
      uVar3 = puVar2[lVar6];
      puVar1[lVar6] = uVar7 + uVar3 * 2;
      uVar7 = uVar3 >> 0x3f;
      lVar6 = lVar6 + 1;
    } while (iVar5 != (int)lVar6);
    if ((long)uVar3 < 0) {
      puVar1[lVar6] = 1;
      r->top = r->top + 1;
    }
  }
  return 1;
}

Assistant:

int BN_lshift1(BIGNUM *r, const BIGNUM *a)
{
    register BN_ULONG *ap, *rp, t, c;
    int i;

    bn_check_top(r);
    bn_check_top(a);

    if (r != a) {
        r->neg = a->neg;
        if (bn_wexpand(r, a->top + 1) == NULL)
            return (0);
        r->top = a->top;
    } else {
        if (bn_wexpand(r, a->top + 1) == NULL)
            return (0);
    }
    ap = a->d;
    rp = r->d;
    c = 0;
    for (i = 0; i < a->top; i++) {
        t = *(ap++);
        *(rp++) = ((t << 1) | c) & BN_MASK2;
        c = (t & BN_TBIT) ? 1 : 0;
    }
    if (c) {
        *rp = 1;
        r->top++;
    }
    bn_check_top(r);
    return (1);
}